

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O2

void test_slow_cert_verify(void)

{
  quicly_sentmap_t *map;
  int64_t now;
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint16_t uVar5;
  uint uVar6;
  bool bVar7;
  quicly_loss_t local_c8;
  
  ::now = 0;
  num_packets_lost = 0;
  map = &local_c8.sentmap;
  local_c8.conf = &quicly_spec_context.loss;
  local_c8.max_ack_delay = &quicly_spec_context.transport_params.max_ack_delay;
  local_c8.ack_delay_exponent = &quicly_spec_context.transport_params.ack_delay_exponent;
  local_c8.pto_count = 0;
  local_c8.time_of_last_packet_sent = 0;
  local_c8.largest_acked_packet_plus1[0] = 0;
  local_c8.largest_acked_packet_plus1[1] = 0;
  local_c8.largest_acked_packet_plus1[2] = 0;
  local_c8.largest_acked_packet_plus1[3] = 0;
  local_c8.total_bytes_sent = 0;
  local_c8.loss_time = 0x7fffffffffffffff;
  local_c8.alarm_at = 0x7fffffffffffffff;
  local_c8.rtt.minimum = 0xffffffff;
  local_c8.rtt.smoothed = 0x14;
  local_c8.rtt.variance = 10;
  local_c8.rtt.latest = 0;
  local_c8.sentmap.head = (st_quicly_sent_block_t *)0x0;
  local_c8.sentmap.tail = (st_quicly_sent_block_t *)0x0;
  local_c8.sentmap.num_packets = 0;
  local_c8.sentmap.bytes_in_flight = 0;
  local_c8.sentmap._pending_packet = (quicly_sent_t *)0x0;
  _ok(1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x90);
  iVar1 = quicly_sentmap_prepare(map,1,::now,'\x02');
  uVar5 = 0x11f;
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x93);
  quicly_sentmap_commit(map,uVar5);
  iVar1 = quicly_sentmap_prepare(map,2,::now,'\x03');
  uVar5 = 0x11f;
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  quicly_sentmap_commit(map,uVar5);
  if (::now == 0x7fffffffffffffff) {
    __assert_fail("last_retransmittable_sent_at != INT64_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                  ,0x101,
                  "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                 );
  }
  if (local_c8.loss_time == 0x7fffffffffffffff) {
    if ('>' < local_c8.pto_count) {
      __assert_fail("r->pto_count < 63",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                    ,0x116,
                    "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                   );
    }
    uVar6 = (local_c8.conf)->min_pto;
    uVar4 = local_c8.rtt.variance * 4;
    if (local_c8.rtt.variance == 0) {
      uVar4 = uVar6;
    }
    if (local_c8.pto_count < '\0') {
      uVar2 = (ulong)(uVar4 + local_c8.rtt.smoothed >> (-local_c8.pto_count & 0x3fU));
      if (uVar2 <= uVar6) {
        uVar2 = (ulong)uVar6;
      }
    }
    else {
      uVar2 = (ulong)(uVar4 + local_c8.rtt.smoothed) << (local_c8.pto_count & 0x3fU);
    }
    if ((long)uVar2 < 1) {
      __assert_fail("now < _t",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                    ,0x138,
                    "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                   );
    }
    lVar3 = uVar2 + ::now;
  }
  else {
    lVar3 = local_c8.loss_time;
    if (local_c8.loss_time <= ::now) {
      __assert_fail("now < _t",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                    ,0x110,
                    "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                   );
    }
  }
  ::now = ::now + 10;
  local_c8.alarm_at = lVar3;
  acked(&local_c8,1,2);
  uVar6 = 0;
  iVar1 = quicly_loss_detect_loss(&local_c8,::now,0,0,on_loss_detected);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x9e);
  _ok((uint)(local_c8.loss_time == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x9f);
  _ok((uint)(num_packets_lost == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  now = local_c8.alarm_at;
  ::now = local_c8.alarm_at;
  local_c8.alarm_at = 0x7fffffffffffffff;
  bVar7 = local_c8.loss_time != 0x7fffffffffffffff;
  if (bVar7) {
    iVar1 = quicly_loss_detect_loss(&local_c8,now,0,0,on_loss_detected);
    uVar4 = (uint)(iVar1 == 0);
  }
  else {
    uVar6 = (uint)((byte)local_c8.pto_count < 0x7f);
    uVar4 = 1;
    local_c8.pto_count = local_c8.pto_count + 1;
  }
  _ok(uVar4,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa5);
  _ok((uint)!bVar7,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa6);
  _ok(uVar6,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa7);
  _ok((uint)(num_packets_lost == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xa8);
  iVar1 = quicly_sentmap_prepare(map,3,::now,'\x02');
  uVar5 = 0x11f;
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xab);
  quicly_sentmap_commit(map,uVar5);
  iVar1 = quicly_sentmap_prepare(map,4,::now,'\x03');
  uVar5 = 0x11f;
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  quicly_sentmap_commit(map,uVar5);
  ::now = ::now + 10;
  acked(&local_c8,3,2);
  iVar1 = quicly_loss_detect_loss(&local_c8,::now,0,0,on_loss_detected);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xb4);
  _ok((uint)(local_c8.loss_time == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xb5);
  _ok((uint)(num_packets_lost == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0xb6);
  quicly_sentmap_dispose(map);
  return;
}

Assistant:

static void test_slow_cert_verify(void)
{
    quicly_loss_t loss;
    int64_t last_retransmittable_sent_at;
    size_t min_packets_to_send;
    int restrict_sending;

    now = 0;
    num_packets_lost = 0;

    quicly_loss_init(&loss, &quicly_spec_context.loss, 20, &quicly_spec_context.transport_params.max_ack_delay,
                     &quicly_spec_context.transport_params.ack_delay_exponent);
    ok(loss.loss_time == INT64_MAX);

    /* sent Handshake+1RTT packet */
    ok(quicly_sentmap_prepare(&loss.sentmap, 1, now, QUICLY_EPOCH_HANDSHAKE) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_sentmap_prepare(&loss.sentmap, 2, now, QUICLY_EPOCH_1RTT) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    last_retransmittable_sent_at = now;
    quicly_loss_update_alarm(&loss, now, last_retransmittable_sent_at, 1, 0, 1, 0, 1);

    now += 10;

    /* receive ack for the Handshake packet, but 1RTT packet remains unacknowledged */
    acked(&loss, 1, QUICLY_EPOCH_HANDSHAKE);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);
    ok(num_packets_lost == 0);

    /* PTO fires */
    now = loss.alarm_at;
    ok(quicly_loss_on_alarm(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, &min_packets_to_send,
                            &restrict_sending, on_loss_detected) == 0);
    ok(restrict_sending);
    ok(min_packets_to_send == 2);
    ok(num_packets_lost == 0);

    /* therefore send probes */
    ok(quicly_sentmap_prepare(&loss.sentmap, 3, now, QUICLY_EPOCH_HANDSHAKE) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_sentmap_prepare(&loss.sentmap, 4, now, QUICLY_EPOCH_1RTT) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);

    now += 10;

    /* again receives an ack for the Handshake packet, but 1RTT packet remains unacknowledged */
    acked(&loss, 3, QUICLY_EPOCH_HANDSHAKE);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);
    ok(num_packets_lost == 0);

    quicly_loss_dispose(&loss);
}